

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
pfederc::LogMessage::LogMessage
          (LogMessage *this,Level logLevel,string *msg,
          vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_> *msgs)

{
  this->_vptr_LogMessage = (_func_int **)&PTR__LogMessage_0010cd30;
  this->logLevel = logLevel;
  std::__cxx11::string::string((string *)&this->msg,(string *)msg);
  std::vector<pfederc::LogMessage,_std::allocator<pfederc::LogMessage>_>::vector(&this->msgs,msgs);
  return;
}

Assistant:

LogMessage::LogMessage(Level logLevel,
    const std::string &msg, const std::vector<LogMessage> &msgs) noexcept
    : logLevel{logLevel}, msg(msg), msgs(msgs) {
}